

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O3

void __thiscall chrono::ChForce::SetRelDir(ChForce *this,ChVector<double> *newf)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChBody *pCVar7;
  double dVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  dVar1 = newf->m_data[1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = newf->m_data[0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = newf->m_data[2];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1 * dVar1;
  auVar9 = vfmadd231sd_fma(auVar18,auVar14,auVar14);
  auVar9 = vfmadd231sd_fma(auVar9,auVar13,auVar13);
  auVar9 = vsqrtsd_avx(auVar9,auVar9);
  bVar10 = 2.2250738585072014e-308 <= auVar9._0_8_;
  dVar17 = 1.0 / auVar9._0_8_;
  dVar8 = (double)((ulong)bVar10 * (long)(newf->m_data[2] * dVar17));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar8;
  auVar12._0_8_ =
       (double)((ulong)bVar10 * (long)(newf->m_data[0] * dVar17) +
               (ulong)!bVar10 * 0x3ff0000000000000);
  auVar12._8_8_ = 0x3ff0000000000000;
  dVar1 = (double)((ulong)bVar10 * (long)(dVar1 * dVar17));
  (this->vreldir).m_data[0] = auVar12._0_8_;
  (this->vreldir).m_data[1] = dVar1;
  (this->vreldir).m_data[2] = dVar8;
  pCVar7 = this->Body;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)&(pCVar7->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x30);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       dVar1 * *(double *)
                ((long)&(pCVar7->super_ChBodyFrame).super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x38);
  auVar9 = vfmadd231sd_fma(auVar15,auVar12,auVar9);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(double *)
                  ((long)&(pCVar7->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       dVar1 * *(double *)
                ((long)&(pCVar7->super_ChBodyFrame).super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x20);
  auVar2 = vfmadd231sd_fma(auVar19,auVar12,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (pCVar7->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                 Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       dVar1 * *(double *)
                ((long)&(pCVar7->super_ChBodyFrame).super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 8);
  auVar3 = vfmadd231sd_fma(auVar16,auVar12,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(double *)
                  ((long)&(pCVar7->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x40);
  auVar9 = vfmadd231sd_fma(auVar9,auVar11,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)&(pCVar7->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x28);
  auVar2 = vfmadd231sd_fma(auVar2,auVar11,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)&(pCVar7->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x10);
  auVar3 = vfmadd231sd_fma(auVar3,auVar11,auVar6);
  (this->vdir).m_data[0] = auVar3._0_8_;
  (this->vdir).m_data[1] = auVar2._0_8_;
  (this->vdir).m_data[2] = auVar9._0_8_;
  UpdateState(this);
  return;
}

Assistant:

inline ChVector<Real>::ChVector(const ChVector<Real>& other) {
    m_data[0] = other.m_data[0];
    m_data[1] = other.m_data[1];
    m_data[2] = other.m_data[2];
}